

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

mapped_type * __thiscall
phmap::priv::
btree_map_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_256,_false>_>_>
::operator[](btree_map_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_256,_false>_>_>
             *this,key_type *k)

{
  key_type *key_ref;
  tuple<> local_29;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_false>
  local_28;
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>,_bool>
  local_20;
  
  local_28._M_head_impl = k;
  btree<phmap::priv::map_params<std::__cxx11::string,long,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>,256,false>>
  ::insert_unique<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&&>,std::tuple<>>
            (&local_20,
             (btree<phmap::priv::map_params<std::__cxx11::string,long,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>,256,false>>
              *)this,k,(piecewise_construct_t *)&std::piecewise_construct,
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
              *)&local_28,&local_29);
  if (((ulong)local_20.first.node & 7) == 0) {
    return (mapped_type *)(local_20.first.node + (long)local_20.first.position * 0x28 + 0x30);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, long, phmap::Less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, long>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, long, phmap::Less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, long>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, long, phmap::Less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, long>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, long, phmap::Less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, long>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
               );
}

Assistant:

mapped_type &operator[](key_type &&k) {
            return try_emplace(std::move(k)).first->second;
        }